

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
* InferTaprootTree(optional<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                   *__return_storage_ptr__,TaprootSpendData *spenddata,XOnlyPubKey *output)

{
  uint256 *puVar1;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
  *pmVar2;
  pointer ppTVar3;
  bool bVar4;
  uint uVar5;
  default_delete<TreeNode> *pdVar6;
  undefined8 *puVar7;
  TreeNode *pTVar8;
  TreeNode *pTVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  undefined1 uVar15;
  uchar *puVar16;
  TreeNode *pTVar17;
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  ulong uVar22;
  uint256 *merkle_root;
  long lVar23;
  _Rb_tree_header *p_Var24;
  TreeNode *__ptr;
  char *pcVar25;
  ulong uVar26;
  long *plVar27;
  long in_FS_OFFSET;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  Span<const_unsigned_char> control;
  Span<const_unsigned_char> a;
  Span<const_unsigned_char> b;
  Span<const_unsigned_char> script;
  vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  ret;
  uint256 hash;
  vector<TreeNode_*,_std::allocator<TreeNode_*>_> stack;
  uint256 leaf_hash;
  TreeNode root;
  optional<std::pair<XOnlyPubKey,_bool>_> tweak;
  int local_170;
  vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  local_128;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [9];
  uchar uStack_df;
  uchar uStack_de;
  uchar uStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  uchar uStack_d9;
  undefined8 local_d8;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  uchar uStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  uchar uStack_c9;
  undefined1 local_c8 [64];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined1 local_70;
  undefined1 local_6e;
  _Storage<std::pair<XOnlyPubKey,_bool>,_true> local_5a;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = &spenddata->merkle_root;
  pmVar2 = &spenddata->scripts;
  puVar16 = std::
            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                      (puVar1,pmVar2);
  merkle_root = (uint256 *)0x0;
  if ((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
       *)puVar16 != pmVar2) {
    merkle_root = puVar1;
  }
  XOnlyPubKey::CreateTapTweak
            ((optional<std::pair<XOnlyPubKey,_bool>_> *)&local_5a._M_value,&spenddata->internal_key,
             merkle_root);
  if ((local_39 != '\x01') ||
     (auVar38[0] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0] ==
                    local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0]),
     auVar38[1] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[1] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[1]),
     auVar38[2] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[2] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[2]),
     auVar38[3] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[3] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[3]),
     auVar38[4] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[4] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[4]),
     auVar38[5] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[5] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[5]),
     auVar38[6] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[6] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[6]),
     auVar38[7] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[7] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[7]),
     auVar38[8] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[8] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[8]),
     auVar38[9] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[9] ==
                   local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[9]),
     auVar38[10] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[10] ==
                    local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[10]),
     auVar38[0xb] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xb] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb]),
     auVar38[0xc] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xc] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc]),
     auVar38[0xd] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xd] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd]),
     auVar38[0xe] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xe] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe]),
     auVar38[0xf] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0xf] ==
                     local_5a._M_value.first.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf]),
     auVar29[0] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x10] ==
                   local_5a._16_1_),
     auVar29[1] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x11] ==
                   local_5a._17_1_),
     auVar29[2] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x12] ==
                   local_5a._18_1_),
     auVar29[3] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x13] ==
                   local_5a._19_1_),
     auVar29[4] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x14] ==
                   local_5a._20_1_),
     auVar29[5] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x15] ==
                   local_5a._21_1_),
     auVar29[6] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x16] ==
                   local_5a._22_1_),
     auVar29[7] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x17] ==
                   local_5a._23_1_),
     auVar29[8] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x18] ==
                   local_5a._24_1_),
     auVar29[9] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x19] ==
                   local_5a._25_1_),
     auVar29[10] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                    local_5a._26_1_),
     auVar29[0xb] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                     local_5a._27_1_),
     auVar29[0xc] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                     local_5a._28_1_),
     auVar29[0xd] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                     local_5a._29_1_),
     auVar29[0xe] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                     local_5a._30_1_),
     auVar29[0xf] = -((output->m_keydata).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                     local_5a._31_1_), auVar29 = auVar29 & auVar38,
     (ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
             (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) != 0xffff)) {
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
    ._M_engaged = false;
    goto LAB_003ebe77;
  }
  local_128.
  super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __ptr = (TreeNode *)pmVar2;
  puVar16 = std::
            __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                      (puVar1);
  if ((map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
       *)puVar16 == pmVar2) {
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
      ._M_impl = local_128.
                 super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
             ._M_impl + 8) =
         local_128.
         super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
             ._M_impl + 0x10) =
         local_128.
         super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_128.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
    ._M_engaged = true;
  }
  else {
    local_88 = (undefined1  [16])0x0;
    local_78 = 0;
    local_70 = 0;
    local_6e = 0;
    local_c8._32_16_ = *(undefined1 (*) [16])(puVar1->super_base_blob<256U>).m_data._M_elems;
    local_c8._48_16_ =
         *(undefined1 (*) [16])
          ((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems + 0x10);
    p_Var21 = (spenddata->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var24 = &(spenddata->scripts)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var21 == p_Var24) {
LAB_003ec3e3:
      _local_e8 = (undefined1  [16])0x0;
      local_d8 = (pointer)0x0;
      local_e8._0_8_ = operator_new(8);
      local_d8 = (pointer)(local_e8._0_8_ + 8);
      *(undefined1 **)local_e8._0_8_ = local_c8 + 0x20;
      stack0xffffffffffffff20 = local_d8;
      bVar28 = (__return_storage_ptr__->
               super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
               ._M_engaged;
      do {
        if ((pointer)local_e8._0_8_ == stack0xffffffffffffff20) {
          (__return_storage_ptr__->
          super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
          ._M_engaged = bVar28;
          *(pointer *)
           &(__return_storage_ptr__->
            super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
            ._M_payload._M_value.
            super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
            ._M_impl = local_128.
                       super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                   ._M_payload._M_value.
                   super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                   ._M_impl + 8) =
               local_128.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                   ._M_payload._M_value.
                   super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
                   ._M_impl + 0x10) =
               local_128.
               super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_128.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_128.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_128.
          super__Vector_base<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->
          super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
          ._M_engaged = true;
          goto LAB_003ec637;
        }
        pTVar17 = stack0xffffffffffffff20[-1];
        bVar4 = pTVar17->explored;
        if (bVar4 == true) {
          ppTVar3 = stack0xffffffffffffff20 + -1;
          if (pTVar17->inner == false) {
            local_c8._0_8_ = ((long)stack0xffffffffffffff20 - local_e8._0_8_ >> 3) + -1;
            __ptr = (TreeNode *)local_c8;
            std::
            vector<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::allocator<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>>
            ::
            emplace_back<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>const&,int_const&>
                      ((vector<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>,std::allocator<std::tuple<int,std::vector<unsigned_char,std::allocator<unsigned_char>>,int>>>
                        *)&local_128,(unsigned_long *)local_c8,&pTVar17->leaf->first,
                       &pTVar17->leaf->second);
LAB_003ec560:
            pTVar17->done = true;
            stack0xffffffffffffff20 = ppTVar3;
          }
          else {
            if ((((pTVar17->sub[0]._M_t.
                   super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                   super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                   super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl)->done == true) &&
                (pTVar8 = pTVar17->sub[1]._M_t.
                          super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                          super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                          super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl,
                pTVar8->done == false)) && (pTVar8->explored == false)) {
              __ptr = (TreeNode *)pTVar8->sub;
              puVar16 = std::
                        __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                  ();
              if ((unique_ptr<TreeNode,_std::default_delete<TreeNode>_> *)puVar16 != pTVar8->sub) {
                __ptr = pTVar17->sub[1]._M_t.
                        super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                        super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                        super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
                a.m_size = 0x20;
                a.m_data = (uchar *)__ptr;
                b.m_size = 0x20;
                b.m_data = (uchar *)__ptr;
                ComputeTapbranchHash((uint256 *)local_c8,a,b);
                auVar40[0] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0] ==
                              local_c8[0]);
                auVar40[1] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[1] ==
                              local_c8[1]);
                auVar40[2] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[2] ==
                              local_c8[2]);
                auVar40[3] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[3] ==
                              local_c8[3]);
                auVar40[4] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[4] ==
                              local_c8[4]);
                auVar40[5] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[5] ==
                              local_c8[5]);
                auVar40[6] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[6] ==
                              local_c8[6]);
                auVar40[7] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[7] ==
                              local_c8[7]);
                auVar40[8] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[8] ==
                              local_c8[8]);
                auVar40[9] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[9] ==
                              local_c8[9]);
                auVar40[10] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[10] ==
                               local_c8[10]);
                auVar40[0xb] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0xb] ==
                                local_c8[0xb]);
                auVar40[0xc] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0xc] ==
                                local_c8[0xc]);
                auVar40[0xd] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0xd] ==
                                local_c8[0xd]);
                auVar40[0xe] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0xe] ==
                                local_c8[0xe]);
                auVar40[0xf] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0xf] ==
                                local_c8[0xf]);
                auVar33[0] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x10] ==
                              local_c8[0x10]);
                auVar33[1] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x11] ==
                              local_c8[0x11]);
                auVar33[2] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x12] ==
                              local_c8[0x12]);
                auVar33[3] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x13] ==
                              local_c8[0x13]);
                auVar33[4] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x14] ==
                              local_c8[0x14]);
                auVar33[5] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x15] ==
                              local_c8[0x15]);
                auVar33[6] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x16] ==
                              local_c8[0x16]);
                auVar33[7] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x17] ==
                              local_c8[0x17]);
                auVar33[8] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x18] ==
                              local_c8[0x18]);
                auVar33[9] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x19] ==
                              local_c8[0x19]);
                auVar33[10] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                               local_c8[0x1a]);
                auVar33[0xb] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                                local_c8[0x1b]);
                auVar33[0xc] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                                local_c8[0x1c]);
                auVar33[0xd] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                                local_c8[0x1d]);
                auVar33[0xe] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                                local_c8[0x1e]);
                auVar33[0xf] = -((pTVar17->hash).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                                local_c8[0x1f]);
                auVar33 = auVar33 & auVar40;
                if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff) {
                  (pTVar17->sub[0]._M_t.
                   super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                   super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                   super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl)->done = false;
                  (pTVar17->sub[1]._M_t.
                   super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                   super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                   super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl)->done = true;
                  goto LAB_003ec5a7;
                }
              }
            }
            pTVar8 = pTVar17->sub[0]._M_t.
                     super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                     super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                     super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
            if (pTVar8->done == true) {
              pTVar9 = pTVar17->sub[1]._M_t.
                       super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                       super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                       super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
              if (pTVar9->done == true) {
                pTVar8->done = false;
                pTVar9->done = false;
                goto LAB_003ec560;
              }
              pTVar17 = pTVar17->sub[1]._M_t.
                        super___uniq_ptr_impl<TreeNode,_std::default_delete<TreeNode>_>._M_t.
                        super__Tuple_impl<0UL,_TreeNode_*,_std::default_delete<TreeNode>_>.
                        super__Head_base<0UL,_TreeNode_*,_false>._M_head_impl;
              if (pTVar17->done == false) {
                __ptr = (TreeNode *)local_c8;
                local_c8._0_8_ = pTVar17;
                std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                          ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)local_e8,
                           (value_type *)local_c8);
              }
            }
            else {
              __ptr = (TreeNode *)local_c8;
              local_c8._0_8_ = pTVar8;
              std::vector<TreeNode_*,_std::allocator<TreeNode_*>_>::push_back
                        ((vector<TreeNode_*,_std::allocator<TreeNode_*>_> *)local_e8,
                         (value_type *)local_c8);
            }
          }
        }
        else {
          bVar28 = false;
        }
LAB_003ec5a7:
      } while (bVar4 != false);
      (__return_storage_ptr__->
      super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
      ._M_engaged = bVar28;
LAB_003ec637:
      if ((pointer)local_e8._0_8_ != (pointer)0x0) {
        __ptr = (TreeNode *)((long)local_d8 - local_e8._0_8_);
        operator_delete((void *)local_e8._0_8_,(ulong)__ptr);
      }
    }
    else {
      do {
        p_Var20 = p_Var21[2]._M_right;
        if (p_Var20 != (_Base_ptr)&p_Var21[2]._M_parent) {
          do {
            uVar5 = *(uint *)&p_Var21[1]._M_right;
            local_170 = 5;
            if ((uVar5 & 0xffffff01) == 0) {
              lVar23 = (long)p_Var20[1]._M_parent - (long)*(byte **)(p_Var20 + 1);
              __ptr = (TreeNode *)(lVar23 - 0x1022);
              if ((((TreeNode *)0xffffffffffffeffe < __ptr) && (((int)lVar23 - 1U & 0x1f) == 0)) &&
                 (uVar5 == (**(byte **)(p_Var20 + 1) & 0xfffffffe))) {
                script.m_size = (long)p_Var21[1]._M_parent - (long)*(uchar **)(p_Var21 + 1);
                script.m_data = *(uchar **)(p_Var21 + 1);
                ComputeTapleafHash((uint256 *)local_c8,(uint8_t)uVar5,script);
                __ptr = *(TreeNode **)(p_Var20 + 1);
                control.m_size = (long)p_Var20[1]._M_parent - (long)__ptr;
                control.m_data = (uchar *)__ptr;
                ComputeTaprootMerkleRoot((uint256 *)local_e8,control,(uint256 *)local_c8);
                auVar39[0] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x10]
                              == (uchar)local_d8);
                auVar39[1] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x11]
                              == local_d8._1_1_);
                auVar39[2] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x12]
                              == local_d8._2_1_);
                auVar39[3] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x13]
                              == local_d8._3_1_);
                auVar39[4] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x14]
                              == local_d8._4_1_);
                auVar39[5] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x15]
                              == local_d8._5_1_);
                auVar39[6] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x16]
                              == local_d8._6_1_);
                auVar39[7] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x17]
                              == local_d8._7_1_);
                auVar39[8] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x18]
                              == uStack_d0);
                auVar39[9] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x19]
                              == uStack_cf);
                auVar39[10] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0x1a]
                               == uStack_ce);
                auVar39[0xb] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1b] == uStack_cd);
                auVar39[0xc] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1c] == uStack_cc);
                auVar39[0xd] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1d] == uStack_cb);
                auVar39[0xe] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1e] == uStack_ca);
                auVar39[0xf] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems
                                 [0x1f] == uStack_c9);
                auVar34[0] = -((puVar1->super_base_blob<256U>).m_data._M_elems[0] == local_e8[0]);
                auVar34[1] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[1] ==
                              local_e8[1]);
                auVar34[2] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[2] ==
                              local_e8[2]);
                auVar34[3] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[3] ==
                              local_e8[3]);
                auVar34[4] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[4] ==
                              local_e8[4]);
                auVar34[5] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[5] ==
                              local_e8[5]);
                auVar34[6] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[6] ==
                              local_e8[6]);
                auVar34[7] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[7] ==
                              local_e8[7]);
                auVar34[8] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[8] ==
                              local_e8[8]);
                auVar34[9] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[9] ==
                              uStack_df);
                auVar34[10] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[10]
                               == uStack_de);
                auVar34[0xb] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xb]
                                == uStack_dd);
                auVar34[0xc] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xc]
                                == uStack_dc);
                auVar34[0xd] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xd]
                                == uStack_db);
                auVar34[0xe] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xe]
                                == uStack_da);
                auVar34[0xf] = -((spenddata->merkle_root).super_base_blob<256U>.m_data._M_elems[0xf]
                                == uStack_d9);
                auVar34 = auVar34 & auVar39;
                local_170 = 5;
                if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                            (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff) {
                  uVar22 = (long)p_Var20[1]._M_parent + (-0x21 - *(long *)(p_Var20 + 1));
                  local_170 = 6;
                  bVar28 = uVar22 >= 0x20;
                  if (uVar22 < 0x20) {
                    plVar27 = (long *)(local_c8 + 0x20);
                  }
                  else {
                    uVar22 = uVar22 >> 5;
                    uVar15 = (__return_storage_ptr__->
                             super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                             ._M_engaged;
                    plVar27 = (long *)(local_c8 + 0x20);
                    uVar19 = 0;
                    do {
                      if ((*(char *)(plVar27 + 7) == '\x01') &&
                         (*(char *)((long)plVar27 + 0x39) == '\0')) {
                        (__return_storage_ptr__->
                        super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                        ._M_engaged = false;
                        local_170 = 1;
                        goto LAB_003ec330;
                      }
                      lVar23 = (~uVar19 + uVar22) * 0x20;
                      pauVar18 = (undefined1 (*) [16])(*(long *)(p_Var20 + 1) + 0x21 + lVar23);
                      uVar10 = *(undefined8 *)*pauVar18;
                      uVar11 = *(undefined8 *)(*pauVar18 + 8);
                      auVar38 = *pauVar18;
                      pauVar18 = (undefined1 (*) [16])(*(long *)(p_Var20 + 1) + 0x31 + lVar23);
                      uVar12 = *(undefined8 *)*pauVar18;
                      uVar13 = *(undefined8 *)(*pauVar18 + 8);
                      auVar29 = *pauVar18;
                      local_108 = auVar38;
                      local_f8 = auVar29;
                      if (plVar27[4] == 0) {
                        *(undefined2 *)(plVar27 + 7) = 0x101;
                        pauVar18 = (undefined1 (*) [16])operator_new(0x40);
                        pauVar18[3] = (undefined1  [16])0x0;
                        pauVar18[1] = (undefined1  [16])0x0;
                        *pauVar18 = (undefined1  [16])0x0;
                        pauVar18[2] = (undefined1  [16])0x0;
                        *(undefined8 *)pauVar18[3] = 0;
                        pauVar18[3][8] = 0;
                        pauVar18[3][10] = 0;
                        pdVar6 = (default_delete<TreeNode> *)plVar27[4];
                        plVar27[4] = (long)pauVar18;
                        if (pdVar6 != (default_delete<TreeNode> *)0x0) {
                          std::default_delete<TreeNode>::operator()(pdVar6,__ptr);
                        }
                        pauVar18 = (undefined1 (*) [16])operator_new(0x40);
                        pauVar18[3] = (undefined1  [16])0x0;
                        pauVar18[1] = (undefined1  [16])0x0;
                        *pauVar18 = (undefined1  [16])0x0;
                        pauVar18[2] = (undefined1  [16])0x0;
                        *(undefined8 *)pauVar18[3] = 0;
                        pauVar18[3][8] = 0;
                        pauVar18[3][10] = 0;
                        pdVar6 = (default_delete<TreeNode> *)plVar27[5];
                        plVar27[5] = (long)pauVar18;
                        if (pdVar6 != (default_delete<TreeNode> *)0x0) {
                          std::default_delete<TreeNode>::operator()(pdVar6,__ptr);
                        }
                        puVar7 = (undefined8 *)plVar27[5];
                        puVar7[2] = local_f8._0_8_;
                        puVar7[3] = local_f8._8_8_;
                        *puVar7 = local_108._0_8_;
                        puVar7[1] = local_108._8_8_;
                        plVar27 = (long *)plVar27[4];
                        bVar4 = true;
                      }
                      else {
                        pcVar25 = (char *)plVar27[4];
                        local_f8[0] = (char)uVar12;
                        local_f8[1] = (char)((ulong)uVar12 >> 8);
                        local_f8[2] = (char)((ulong)uVar12 >> 0x10);
                        local_f8[3] = (char)((ulong)uVar12 >> 0x18);
                        local_f8[4] = (char)((ulong)uVar12 >> 0x20);
                        local_f8[5] = (char)((ulong)uVar12 >> 0x28);
                        local_f8[6] = (char)((ulong)uVar12 >> 0x30);
                        local_f8[7] = (char)((ulong)uVar12 >> 0x38);
                        local_f8[8] = (char)uVar13;
                        local_f8[9] = (char)((ulong)uVar13 >> 8);
                        local_f8[10] = (char)((ulong)uVar13 >> 0x10);
                        local_f8[0xb] = (char)((ulong)uVar13 >> 0x18);
                        local_f8[0xc] = (char)((ulong)uVar13 >> 0x20);
                        local_f8[0xd] = (char)((ulong)uVar13 >> 0x28);
                        local_f8[0xe] = (char)((ulong)uVar13 >> 0x30);
                        local_f8[0xf] = (char)((ulong)uVar13 >> 0x38);
                        auVar35[0] = -(pcVar25[0x10] == local_f8[0]);
                        auVar35[1] = -(pcVar25[0x11] == local_f8[1]);
                        auVar35[2] = -(pcVar25[0x12] == local_f8[2]);
                        auVar35[3] = -(pcVar25[0x13] == local_f8[3]);
                        auVar35[4] = -(pcVar25[0x14] == local_f8[4]);
                        auVar35[5] = -(pcVar25[0x15] == local_f8[5]);
                        auVar35[6] = -(pcVar25[0x16] == local_f8[6]);
                        auVar35[7] = -(pcVar25[0x17] == local_f8[7]);
                        auVar35[8] = -(pcVar25[0x18] == local_f8[8]);
                        auVar35[9] = -(pcVar25[0x19] == local_f8[9]);
                        auVar35[10] = -(pcVar25[0x1a] == local_f8[10]);
                        auVar35[0xb] = -(pcVar25[0x1b] == local_f8[0xb]);
                        auVar35[0xc] = -(pcVar25[0x1c] == local_f8[0xc]);
                        auVar35[0xd] = -(pcVar25[0x1d] == local_f8[0xd]);
                        auVar35[0xe] = -(pcVar25[0x1e] == local_f8[0xe]);
                        auVar35[0xf] = -(pcVar25[0x1f] == local_f8[0xf]);
                        local_108[0] = (char)uVar10;
                        local_108[1] = (char)((ulong)uVar10 >> 8);
                        local_108[2] = (char)((ulong)uVar10 >> 0x10);
                        local_108[3] = (char)((ulong)uVar10 >> 0x18);
                        local_108[4] = (char)((ulong)uVar10 >> 0x20);
                        local_108[5] = (char)((ulong)uVar10 >> 0x28);
                        local_108[6] = (char)((ulong)uVar10 >> 0x30);
                        local_108[7] = (char)((ulong)uVar10 >> 0x38);
                        local_108[8] = (char)uVar11;
                        local_108[9] = (char)((ulong)uVar11 >> 8);
                        local_108[10] = (char)((ulong)uVar11 >> 0x10);
                        local_108[0xb] = (char)((ulong)uVar11 >> 0x18);
                        local_108[0xc] = (char)((ulong)uVar11 >> 0x20);
                        local_108[0xd] = (char)((ulong)uVar11 >> 0x28);
                        local_108[0xe] = (char)((ulong)uVar11 >> 0x30);
                        local_108[0xf] = (char)((ulong)uVar11 >> 0x38);
                        auVar30[0] = -(*pcVar25 == local_108[0]);
                        auVar30[1] = -(pcVar25[1] == local_108[1]);
                        auVar30[2] = -(pcVar25[2] == local_108[2]);
                        auVar30[3] = -(pcVar25[3] == local_108[3]);
                        auVar30[4] = -(pcVar25[4] == local_108[4]);
                        auVar30[5] = -(pcVar25[5] == local_108[5]);
                        auVar30[6] = -(pcVar25[6] == local_108[6]);
                        auVar30[7] = -(pcVar25[7] == local_108[7]);
                        auVar30[8] = -(pcVar25[8] == local_108[8]);
                        auVar30[9] = -(pcVar25[9] == local_108[9]);
                        auVar30[10] = -(pcVar25[10] == local_108[10]);
                        auVar30[0xb] = -(pcVar25[0xb] == local_108[0xb]);
                        auVar30[0xc] = -(pcVar25[0xc] == local_108[0xc]);
                        auVar30[0xd] = -(pcVar25[0xd] == local_108[0xd]);
                        auVar30[0xe] = -(pcVar25[0xe] == local_108[0xe]);
                        auVar30[0xf] = -(pcVar25[0xf] == local_108[0xf]);
                        auVar30 = auVar30 & auVar35;
                        bVar14 = true;
                        if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                     (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                     (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                     (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                     (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                     (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                     (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                     (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                     (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                     (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                     (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                     (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                     (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                     (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                                    (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) {
                          uVar26 = 0;
                        }
                        else {
                          uVar26 = 0;
                          bVar4 = true;
                          do {
                            __ptr = (TreeNode *)(pcVar25 + 0x20);
                            pTVar17 = (TreeNode *)
                                      std::
                                      __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                                                ();
                            auVar38 = local_108;
                            auVar29 = local_f8;
                            if (pTVar17 == (TreeNode *)(pcVar25 + 0x20)) {
                              pcVar25 = (char *)plVar27[(uVar26 ^ 1) + 4];
                              auVar36[0] = -(pcVar25[0x10] == local_f8[0]);
                              auVar36[1] = -(pcVar25[0x11] == local_f8[1]);
                              auVar36[2] = -(pcVar25[0x12] == local_f8[2]);
                              auVar36[3] = -(pcVar25[0x13] == local_f8[3]);
                              auVar36[4] = -(pcVar25[0x14] == local_f8[4]);
                              auVar36[5] = -(pcVar25[0x15] == local_f8[5]);
                              auVar36[6] = -(pcVar25[0x16] == local_f8[6]);
                              auVar36[7] = -(pcVar25[0x17] == local_f8[7]);
                              auVar36[8] = -(pcVar25[0x18] == local_f8[8]);
                              auVar36[9] = -(pcVar25[0x19] == local_f8[9]);
                              auVar36[10] = -(pcVar25[0x1a] == local_f8[10]);
                              auVar36[0xb] = -(pcVar25[0x1b] == local_f8[0xb]);
                              auVar36[0xc] = -(pcVar25[0x1c] == local_f8[0xc]);
                              auVar36[0xd] = -(pcVar25[0x1d] == local_f8[0xd]);
                              auVar36[0xe] = -(pcVar25[0x1e] == local_f8[0xe]);
                              auVar36[0xf] = -(pcVar25[0x1f] == local_f8[0xf]);
                              auVar31[0] = -(*pcVar25 == local_108[0]);
                              auVar31[1] = -(pcVar25[1] == local_108[1]);
                              auVar31[2] = -(pcVar25[2] == local_108[2]);
                              auVar31[3] = -(pcVar25[3] == local_108[3]);
                              auVar31[4] = -(pcVar25[4] == local_108[4]);
                              auVar31[5] = -(pcVar25[5] == local_108[5]);
                              auVar31[6] = -(pcVar25[6] == local_108[6]);
                              auVar31[7] = -(pcVar25[7] == local_108[7]);
                              auVar31[8] = -(pcVar25[8] == local_108[8]);
                              auVar31[9] = -(pcVar25[9] == local_108[9]);
                              auVar31[10] = -(pcVar25[10] == local_108[10]);
                              auVar31[0xb] = -(pcVar25[0xb] == local_108[0xb]);
                              auVar31[0xc] = -(pcVar25[0xc] == local_108[0xc]);
                              auVar31[0xd] = -(pcVar25[0xd] == local_108[0xd]);
                              auVar31[0xe] = -(pcVar25[0xe] == local_108[0xe]);
                              auVar31[0xf] = -(pcVar25[0xf] == local_108[0xf]);
                              auVar31 = auVar31 & auVar36;
                              if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                                           (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                                           (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                                           (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                                           (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                                           (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                                           (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                                           (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                                           (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                                           (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                                           (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                                           (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                                           (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                                           (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                                          (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff)
                              break;
                            }
                            if (!bVar4) goto LAB_003ec2a5;
                            pcVar25 = (char *)plVar27[5];
                            auVar37[0] = -(pcVar25[0x10] == local_f8[0]);
                            auVar37[1] = -(pcVar25[0x11] == local_f8[1]);
                            auVar37[2] = -(pcVar25[0x12] == local_f8[2]);
                            auVar37[3] = -(pcVar25[0x13] == local_f8[3]);
                            auVar37[4] = -(pcVar25[0x14] == local_f8[4]);
                            auVar37[5] = -(pcVar25[0x15] == local_f8[5]);
                            auVar37[6] = -(pcVar25[0x16] == local_f8[6]);
                            auVar37[7] = -(pcVar25[0x17] == local_f8[7]);
                            auVar37[8] = -(pcVar25[0x18] == local_f8[8]);
                            auVar37[9] = -(pcVar25[0x19] == local_f8[9]);
                            auVar37[10] = -(pcVar25[0x1a] == local_f8[10]);
                            auVar37[0xb] = -(pcVar25[0x1b] == local_f8[0xb]);
                            auVar37[0xc] = -(pcVar25[0x1c] == local_f8[0xc]);
                            auVar37[0xd] = -(pcVar25[0x1d] == local_f8[0xd]);
                            auVar37[0xe] = -(pcVar25[0x1e] == local_f8[0xe]);
                            auVar37[0xf] = -(pcVar25[0x1f] == local_f8[0xf]);
                            auVar32[0] = -(*pcVar25 == local_108[0]);
                            auVar32[1] = -(pcVar25[1] == local_108[1]);
                            auVar32[2] = -(pcVar25[2] == local_108[2]);
                            auVar32[3] = -(pcVar25[3] == local_108[3]);
                            auVar32[4] = -(pcVar25[4] == local_108[4]);
                            auVar32[5] = -(pcVar25[5] == local_108[5]);
                            auVar32[6] = -(pcVar25[6] == local_108[6]);
                            auVar32[7] = -(pcVar25[7] == local_108[7]);
                            auVar32[8] = -(pcVar25[8] == local_108[8]);
                            auVar32[9] = -(pcVar25[9] == local_108[9]);
                            auVar32[10] = -(pcVar25[10] == local_108[10]);
                            auVar32[0xb] = -(pcVar25[0xb] == local_108[0xb]);
                            auVar32[0xc] = -(pcVar25[0xc] == local_108[0xc]);
                            auVar32[0xd] = -(pcVar25[0xd] == local_108[0xd]);
                            auVar32[0xe] = -(pcVar25[0xe] == local_108[0xe]);
                            auVar32[0xf] = -(pcVar25[0xf] == local_108[0xf]);
                            auVar32 = auVar32 & auVar37;
                            uVar26 = 1;
                            bVar14 = bVar4;
                            bVar4 = false;
                          } while ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                            (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                            (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                            (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                            (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                            (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                            (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                            (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                            (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                            (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                                           (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff);
                        }
                        bVar4 = bVar14;
                        local_f8 = auVar29;
                        local_108 = auVar38;
                        puVar7 = (undefined8 *)plVar27[uVar26 + 4];
                        puVar7[2] = local_f8._0_8_;
                        puVar7[3] = local_f8._8_8_;
                        *puVar7 = local_108._0_8_;
                        puVar7[1] = local_108._8_8_;
                        plVar27 = (long *)plVar27[(ulong)(1 - (int)uVar26) + 4];
LAB_003ec2a5:
                        if (!bVar4) {
                          uVar15 = false;
                        }
                      }
                      if (!bVar4) {
                        (__return_storage_ptr__->
                        super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                        ._M_engaged = (bool)uVar15;
                        local_170 = 1;
                        goto LAB_003ec330;
                      }
                      uVar19 = uVar19 + 1;
                      bVar28 = uVar19 < uVar22;
                    } while (uVar19 != uVar22 + (uVar22 == 0));
                    (__return_storage_ptr__->
                    super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                    ._M_engaged = (bool)uVar15;
                  }
LAB_003ec330:
                  if (!bVar28) {
                    if (plVar27[4] == 0) {
                      *(undefined2 *)(plVar27 + 7) = 1;
                      plVar27[6] = (long)(p_Var21 + 1);
                      *plVar27 = local_c8._0_8_;
                      plVar27[1] = CONCAT17(local_c8[0xf],
                                            CONCAT16(local_c8[0xe],
                                                     CONCAT15(local_c8[0xd],
                                                              CONCAT14(local_c8[0xc],
                                                                       CONCAT13(local_c8[0xb],
                                                                                CONCAT12(local_c8[10
                                                  ],CONCAT11(local_c8[9],local_c8[8])))))));
                      plVar27[2] = CONCAT17(local_c8[0x17],
                                            CONCAT16(local_c8[0x16],
                                                     CONCAT15(local_c8[0x15],
                                                              CONCAT14(local_c8[0x14],
                                                                       CONCAT13(local_c8[0x13],
                                                                                CONCAT12(local_c8[
                                                  0x12],CONCAT11(local_c8[0x11],local_c8[0x10]))))))
                                           );
                      plVar27[3] = CONCAT17(local_c8[0x1f],
                                            CONCAT16(local_c8[0x1e],
                                                     CONCAT15(local_c8[0x1d],
                                                              CONCAT14(local_c8[0x1c],
                                                                       CONCAT13(local_c8[0x1b],
                                                                                CONCAT12(local_c8[
                                                  0x1a],CONCAT11(local_c8[0x19],local_c8[0x18]))))))
                                           );
                      local_170 = 0;
                    }
                    else {
                      (__return_storage_ptr__->
                      super__Optional_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>_>
                      ._M_engaged = false;
                      local_170 = 1;
                    }
                  }
                }
              }
            }
            if ((local_170 != 5) && (local_170 != 0)) goto LAB_003ec3ac;
            p_Var20 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var20);
          } while (p_Var20 != (_Base_ptr)&p_Var21[2]._M_parent);
        }
        local_170 = 4;
LAB_003ec3ac:
        if (local_170 == 4) {
          local_170 = 0;
        }
        if (local_170 != 0) goto LAB_003ec3d5;
        p_Var21 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var21);
      } while ((_Rb_tree_header *)p_Var21 != p_Var24);
      local_170 = 2;
LAB_003ec3d5:
      if (local_170 == 2) goto LAB_003ec3e3;
    }
    lVar23 = 0x28;
    do {
      if (*(default_delete<TreeNode> **)(local_c8 + lVar23 + 0x20) !=
          (default_delete<TreeNode> *)0x0) {
        std::default_delete<TreeNode>::operator()
                  (*(default_delete<TreeNode> **)(local_c8 + lVar23 + 0x20),__ptr);
      }
      *(undefined8 *)(local_c8 + lVar23 + 0x20) = 0;
      lVar23 = lVar23 + -8;
    } while (lVar23 != 0x18);
  }
  std::
  vector<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::allocator<std::tuple<int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>_>
  ::~vector(&local_128);
LAB_003ebe77:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::vector<std::tuple<int, std::vector<unsigned char>, int>>> InferTaprootTree(const TaprootSpendData& spenddata, const XOnlyPubKey& output)
{
    // Verify that the output matches the assumed Merkle root and internal key.
    auto tweak = spenddata.internal_key.CreateTapTweak(spenddata.merkle_root.IsNull() ? nullptr : &spenddata.merkle_root);
    if (!tweak || tweak->first != output) return std::nullopt;
    // If the Merkle root is 0, the tree is empty, and we're done.
    std::vector<std::tuple<int, std::vector<unsigned char>, int>> ret;
    if (spenddata.merkle_root.IsNull()) return ret;

    /** Data structure to represent the nodes of the tree we're going to build. */
    struct TreeNode {
        /** Hash of this node, if known; 0 otherwise. */
        uint256 hash;
        /** The left and right subtrees (note that their order is irrelevant). */
        std::unique_ptr<TreeNode> sub[2];
        /** If this is known to be a leaf node, a pointer to the (script, leaf_ver) pair.
         *  nullptr otherwise. */
        const std::pair<std::vector<unsigned char>, int>* leaf = nullptr;
        /** Whether or not this node has been explored (is known to be a leaf, or known to have children). */
        bool explored = false;
        /** Whether or not this node is an inner node (unknown until explored = true). */
        bool inner;
        /** Whether or not we have produced output for this subtree. */
        bool done = false;
    };

    // Build tree from the provided branches.
    TreeNode root;
    root.hash = spenddata.merkle_root;
    for (const auto& [key, control_blocks] : spenddata.scripts) {
        const auto& [script, leaf_ver] = key;
        for (const auto& control : control_blocks) {
            // Skip script records with nonsensical leaf version.
            if (leaf_ver < 0 || leaf_ver >= 0x100 || leaf_ver & 1) continue;
            // Skip script records with invalid control block sizes.
            if (control.size() < TAPROOT_CONTROL_BASE_SIZE || control.size() > TAPROOT_CONTROL_MAX_SIZE ||
                ((control.size() - TAPROOT_CONTROL_BASE_SIZE) % TAPROOT_CONTROL_NODE_SIZE) != 0) continue;
            // Skip script records that don't match the control block.
            if ((control[0] & TAPROOT_LEAF_MASK) != leaf_ver) continue;
            // Skip script records that don't match the provided Merkle root.
            const uint256 leaf_hash = ComputeTapleafHash(leaf_ver, script);
            const uint256 merkle_root = ComputeTaprootMerkleRoot(control, leaf_hash);
            if (merkle_root != spenddata.merkle_root) continue;

            TreeNode* node = &root;
            size_t levels = (control.size() - TAPROOT_CONTROL_BASE_SIZE) / TAPROOT_CONTROL_NODE_SIZE;
            for (size_t depth = 0; depth < levels; ++depth) {
                // Can't descend into a node which we already know is a leaf.
                if (node->explored && !node->inner) return std::nullopt;

                // Extract partner hash from Merkle branch in control block.
                uint256 hash;
                std::copy(control.begin() + TAPROOT_CONTROL_BASE_SIZE + (levels - 1 - depth) * TAPROOT_CONTROL_NODE_SIZE,
                          control.begin() + TAPROOT_CONTROL_BASE_SIZE + (levels - depth) * TAPROOT_CONTROL_NODE_SIZE,
                          hash.begin());

                if (node->sub[0]) {
                    // Descend into the existing left or right branch.
                    bool desc = false;
                    for (int i = 0; i < 2; ++i) {
                        if (node->sub[i]->hash == hash || (node->sub[i]->hash.IsNull() && node->sub[1-i]->hash != hash)) {
                            node->sub[i]->hash = hash;
                            node = &*node->sub[1-i];
                            desc = true;
                            break;
                        }
                    }
                    if (!desc) return std::nullopt; // This probably requires a hash collision to hit.
                } else {
                    // We're in an unexplored node. Create subtrees and descend.
                    node->explored = true;
                    node->inner = true;
                    node->sub[0] = std::make_unique<TreeNode>();
                    node->sub[1] = std::make_unique<TreeNode>();
                    node->sub[1]->hash = hash;
                    node = &*node->sub[0];
                }
            }
            // Cannot turn a known inner node into a leaf.
            if (node->sub[0]) return std::nullopt;
            node->explored = true;
            node->inner = false;
            node->leaf = &key;
            node->hash = leaf_hash;
        }
    }

    // Recursive processing to turn the tree into flattened output. Use an explicit stack here to avoid
    // overflowing the call stack (the tree may be 128 levels deep).
    std::vector<TreeNode*> stack{&root};
    while (!stack.empty()) {
        TreeNode& node = *stack.back();
        if (!node.explored) {
            // Unexplored node, which means the tree is incomplete.
            return std::nullopt;
        } else if (!node.inner) {
            // Leaf node; produce output.
            ret.emplace_back(stack.size() - 1, node.leaf->first, node.leaf->second);
            node.done = true;
            stack.pop_back();
        } else if (node.sub[0]->done && !node.sub[1]->done && !node.sub[1]->explored && !node.sub[1]->hash.IsNull() &&
                   ComputeTapbranchHash(node.sub[1]->hash, node.sub[1]->hash) == node.hash) {
            // Whenever there are nodes with two identical subtrees under it, we run into a problem:
            // the control blocks for the leaves underneath those will be identical as well, and thus
            // they will all be matched to the same path in the tree. The result is that at the location
            // where the duplicate occurred, the left child will contain a normal tree that can be explored
            // and processed, but the right one will remain unexplored.
            //
            // This situation can be detected, by encountering an inner node with unexplored right subtree
            // with known hash, and H_TapBranch(hash, hash) is equal to the parent node (this node)'s hash.
            //
            // To deal with this, simply process the left tree a second time (set its done flag to false;
            // noting that the done flag of its children have already been set to false after processing
            // those). To avoid ending up in an infinite loop, set the done flag of the right (unexplored)
            // subtree to true.
            node.sub[0]->done = false;
            node.sub[1]->done = true;
        } else if (node.sub[0]->done && node.sub[1]->done) {
            // An internal node which we're finished with.
            node.sub[0]->done = false;
            node.sub[1]->done = false;
            node.done = true;
            stack.pop_back();
        } else if (!node.sub[0]->done) {
            // An internal node whose left branch hasn't been processed yet. Do so first.
            stack.push_back(&*node.sub[0]);
        } else if (!node.sub[1]->done) {
            // An internal node whose right branch hasn't been processed yet. Do so first.
            stack.push_back(&*node.sub[1]);
        }
    }

    return ret;
}